

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_time.cpp
# Opt level: O1

void sc_core::sc_set_default_time_unit(double v,sc_time_unit tu)

{
  sc_time_params *psVar1;
  sc_simcontext *psVar2;
  sc_simcontext *this;
  double dVar3;
  double time_unit;
  double dummy;
  double local_28;
  
  if (sc_set_default_time_unit(double,sc_core::sc_time_unit)::warn_default_time_unit == '\0') {
    sc_set_default_time_unit(double,sc_core::sc_time_unit)::warn_default_time_unit = '\x01';
    sc_report_handler::report
              (SC_INFO,"/IEEE_Std_1666/deprecated","deprecated function: sc_set_default_time_unit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_time.cpp"
               ,0x1b5);
  }
  if (v < 0.0) {
    sc_report_handler::report
              (SC_ERROR,"set default time unit failed","value not positive",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_time.cpp"
               ,0x1bc);
  }
  dVar3 = log10(v);
  dVar3 = modf(dVar3,&local_28);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    sc_report_handler::report
              (SC_ERROR,"set default time unit failed","value not a power of ten",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_time.cpp"
               ,0x1c3);
  }
  if (sc_curr_simcontext == (sc_simcontext *)0x0) {
    psVar2 = (sc_simcontext *)operator_new(0x168);
    sc_simcontext::sc_simcontext(psVar2);
    sc_curr_simcontext = psVar2;
    sc_default_global_context = psVar2;
  }
  psVar2 = sc_curr_simcontext;
  if (sc_curr_simcontext == (sc_simcontext *)0x0) {
    this = (sc_simcontext *)operator_new(0x168);
    sc_simcontext::sc_simcontext(this);
    sc_curr_simcontext = this;
    sc_default_global_context = this;
  }
  if (sc_curr_simcontext->m_ready_to_simulate == true) {
    sc_report_handler::report
              (SC_ERROR,"set default time unit failed","simulation running",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_time.cpp"
               ,0x1ca);
  }
  psVar1 = psVar2->m_time_params;
  if (psVar1->time_resolution_fixed == true) {
    sc_report_handler::report
              (SC_ERROR,"set default time unit failed","sc_time object(s) constructed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_time.cpp"
               ,0x1d2);
  }
  if (psVar1->default_time_unit_specified == true) {
    sc_report_handler::report
              (SC_ERROR,"set default time unit failed","already specified",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_time.cpp"
               ,0x1d7);
  }
  dVar3 = (v * *(double *)(time_values + (ulong)tu * 8)) / psVar1->time_resolution;
  if (dVar3 < 1.0) {
    sc_report_handler::report
              (SC_ERROR,"set default time unit failed","value smaller than time resolution",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_time.cpp"
               ,0x1df);
  }
  psVar1->default_time_unit = (long)dVar3;
  psVar1->default_time_unit_specified = true;
  return;
}

Assistant:

void
sc_set_default_time_unit( double v, sc_time_unit tu )
{
    static bool warn_default_time_unit=true;
    if ( warn_default_time_unit )
    {
        warn_default_time_unit=false;
        SC_REPORT_INFO(SC_ID_IEEE_1666_DEPRECATION_,
	    "deprecated function: sc_set_default_time_unit");
    }

    // first perform the necessary checks

    // must be positive
    if( v < 0.0 ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_, "value not positive" );
    }

    // must be a power of ten
    double dummy;
    if( modf( log10( v ), &dummy ) != 0.0 ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_,
			 "value not a power of ten" );
    }

    sc_simcontext* simc = sc_get_curr_simcontext();

    // can only be specified during elaboration
    if( sc_is_running() ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_, "simulation running" );
    }

    sc_time_params* time_params = simc->m_time_params;

    // can only be specified before any sc_time is constructed
    if( time_params->time_resolution_fixed ) {
        SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_,
                         "sc_time object(s) constructed" );
    }

    // can be specified only once
    if( time_params->default_time_unit_specified ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_, "already specified" );
    }

    // must be larger than or equal to the time resolution
    volatile double time_unit = ( v * time_values[tu] ) /
	                        time_params->time_resolution;
    if( time_unit < 1.0 ) {
	SC_REPORT_ERROR( SC_ID_SET_DEFAULT_TIME_UNIT_,
			 "value smaller than time resolution" );
    }

    time_params->default_time_unit = static_cast<sc_dt::int64>( time_unit );
    time_params->default_time_unit_specified = true;
}